

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so_layer.cpp
# Opt level: O1

environment_t * __thiscall so_5::layer_t::so_environment(layer_t *this)

{
  exception_t *this_00;
  string local_40;
  
  if (this->m_env != (environment_t *)0x0) {
    return this->m_env;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"so_environment isn\'t bound to this layer","");
  exception_t::exception_t(this_00,&local_40,100);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

environment_t &
layer_t::so_environment()
{
	if( nullptr == m_env )
	{
		throw so_5::exception_t(
			"so_environment isn't bound to this layer",
			rc_layer_not_binded_to_so_env );
	}

	return *m_env;
}